

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermoParser.cpp
# Opt level: O1

bool __thiscall IO::ThermoParser::setThermoDataFor(ThermoParser *this,Species *species)

{
  pointer pcVar1;
  double dVar2;
  size_type sVar3;
  ulong uVar4;
  int iVar5;
  string *str;
  Thermo *pTVar6;
  ulong __n;
  long lVar7;
  pointer pTVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  string local_70;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  pTVar8 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar10 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
           super__Vector_impl_data._M_finish != pTVar8;
  if (bVar10) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      str = Thermo::getSpeciesName_abi_cxx11_
                      ((Thermo *)((long)&(pTVar8->species_name_)._M_dataplus._M_p + lVar7));
      convertToCaps(&local_70,str);
      pcVar1 = (species->name_)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (species->name_)._M_string_length);
      uVar4 = local_48;
      sVar3 = local_70._M_string_length;
      __n = local_70._M_string_length;
      if (local_48 < local_70._M_string_length) {
        __n = local_48;
      }
      if (__n == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp(local_70._M_dataplus._M_p,local_50,__n);
        bVar11 = iVar5 == 0;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((bool)(bVar11 & sVar3 == uVar4)) {
        pTVar8 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar6 = Species::thermo(species);
        std::__cxx11::string::_M_assign((string *)pTVar6);
        std::__cxx11::string::_M_assign((string *)&pTVar6->note_);
        std::__cxx11::string::_M_assign((string *)&pTVar6->phase_);
        pTVar6->T_high_ = *(double *)((long)&pTVar8->T_high_ + lVar7);
        dVar2 = *(double *)((long)&pTVar8->T_common_ + lVar7);
        pTVar6->T_low_ = *(double *)((long)&pTVar8->T_low_ + lVar7);
        pTVar6->T_common_ = dVar2;
        std::vector<double,_std::allocator<double>_>::operator=
                  (&pTVar6->al_,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(pTVar8->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   + lVar7));
        std::vector<double,_std::allocator<double>_>::operator=
                  (&pTVar6->ah_,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(pTVar8->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   + lVar7));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::operator=(&(pTVar6->elements_map_)._M_t,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)((long)&(pTVar8->elements_map_)._M_t._M_impl + lVar7));
        return bVar10;
      }
      uVar9 = uVar9 + 1;
      pTVar8 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0xd8;
      bVar10 = uVar9 < (ulong)(((long)(this->thermos_).
                                      super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 3)
                              * -0x7b425ed097b425ed);
    } while (bVar10);
  }
  return bVar10;
}

Assistant:

bool IO::ThermoParser::setThermoDataFor(IO::Species& species) {
    for (size_t i = 0; i < thermos_.size(); ++i) {
        if (convertToCaps(thermos_[i].getSpeciesName()).compare(species.name()) == 0) {
            species.thermo() = thermos_[i];
            return true;
        }
    }
    return false;
}